

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O2

sunrealtype SUNRpowerI(sunrealtype base,int exponent)

{
  int iVar1;
  bool bVar2;
  sunrealtype sVar3;
  
  iVar1 = -exponent;
  if (0 < exponent) {
    iVar1 = exponent;
  }
  sVar3 = 1.0;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    sVar3 = sVar3 * base;
  }
  if (exponent < 0) {
    sVar3 = 1.0 / sVar3;
  }
  return sVar3;
}

Assistant:

sunrealtype SUNRpowerI(sunrealtype base, int exponent)
{
  int i, expt;
  sunrealtype prod;

  prod = SUN_RCONST(1.0);
  expt = abs(exponent);
  for (i = 1; i <= expt; i++) { prod *= base; }
  if (exponent < 0) { prod = SUN_RCONST(1.0) / prod; }
  return (prod);
}